

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

bool testing::internal::TuplePrefix<2ul>::
     Matches<std::tuple<testing::Matcher<int>,testing::Matcher<double>>,std::tuple<int,double>>
               (tuple<testing::Matcher<int>,_testing::Matcher<double>_> *matcher_tuple,
               tuple<int,_double> *value_tuple)

{
  MatcherInterface<int> *pMVar1;
  undefined1 uVar2;
  int iVar3;
  
  pMVar1 = (matcher_tuple->super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>_>)
           .super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
           impl_.value_;
  iVar3 = (*(pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                    (pMVar1,(ulong)(uint)(value_tuple->super__Tuple_impl<0UL,_int,_double>).
                                         super__Head_base<0UL,_int,_false>._M_head_impl);
  if ((char)iVar3 == '\0') {
    uVar2 = 0;
  }
  else {
    iVar3 = (*(((matcher_tuple->
                super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>_>).
                super__Tuple_impl<1UL,_testing::Matcher<double>_>.
                super__Head_base<1UL,_testing::Matcher<double>,_false>._M_head_impl.
                super_MatcherBase<double>.impl_.value_)->super_MatcherDescriberInterface).
              _vptr_MatcherDescriberInterface[4])
                      ((value_tuple->super__Tuple_impl<0UL,_int,_double>).
                       super__Tuple_impl<1UL,_double>.super__Head_base<1UL,_double,_false>.
                       _M_head_impl);
    uVar2 = (undefined1)iVar3;
  }
  return (bool)uVar2;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    using ::std::tr1::get;
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple)
        && get<N - 1>(matcher_tuple).Matches(get<N - 1>(value_tuple));
  }